

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::log<char_const(&)[173],kj::String>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [173],
               String *params_1)

{
  undefined4 in_register_00000014;
  String *params_00;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> in_stack_ffffffffffffff08;
  ArrayDisposer **local_c0;
  undefined1 local_68 [8];
  String argValues [2];
  String *params_local_1;
  char (*params_local) [173];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  str<char_const(&)[173]>
            ((String *)local_68,(kj *)params,(char (*) [173])CONCAT44(in_register_00000014,severity)
            );
  str<kj::String&>((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  AVar1 = arrayPtr<kj::String>((String *)local_68,2);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)AVar1.ptr,in_stack_ffffffffffffff08);
  local_c0 = &argValues[1].content.disposer;
  do {
    local_c0 = local_c0 + -3;
    String::~String((String *)local_c0);
  } while (local_c0 != (ArrayDisposer **)local_68);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}